

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcBinaryStream.h
# Opt level: O3

void __thiscall o3dgc::BinaryStream::WriteUIntASCII(BinaryStream *this,unsigned_long value)

{
  bool bVar1;
  ulong uVar2;
  uchar local_23;
  uchar local_22;
  uchar local_21;
  
  if (value < 0x7f) {
    Vector<unsigned_char>::PushBack(&this->m_stream,&local_22);
  }
  else {
    Vector<unsigned_char>::PushBack(&this->m_stream,&local_21);
    uVar2 = value - 0x7f;
    do {
      Vector<unsigned_char>::PushBack(&this->m_stream,&local_23);
      bVar1 = 0x3f < uVar2;
      uVar2 = uVar2 >> 6;
    } while (bVar1);
  }
  return;
}

Assistant:

void                    WriteUIntASCII(unsigned long value) 
                                {
                                    if (value >= O3DGC_BINARY_STREAM_MAX_SYMBOL0)
                                    {
                                        m_stream.PushBack(O3DGC_BINARY_STREAM_MAX_SYMBOL0);
                                        value -= O3DGC_BINARY_STREAM_MAX_SYMBOL0;
                                        unsigned char a, b;
                                        do
                                        {
                                            a  = ((value & O3DGC_BINARY_STREAM_MAX_SYMBOL1) << 1);
                                            b  = ( (value >>= O3DGC_BINARY_STREAM_BITS_PER_SYMBOL1) > 0);
                                            a += b;
                                            m_stream.PushBack(a);
                                        } while (b);
                                    }
                                    else
                                    {
                                        m_stream.PushBack((unsigned char) value);
                                    }
                                }